

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_add_raw_output
              (wally_tx *tx,uint64_t satoshi,uchar *script,size_t script_len,uint32_t flags)

{
  int iVar1;
  
  if (tx != (wally_tx *)0x0) {
    iVar1 = tx_add_elements_raw_output_at
                      (tx,(uint32_t)tx->num_outputs,satoshi,script,script_len,(uchar *)0x0,0,
                       (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,flags,false);
    return iVar1;
  }
  return -2;
}

Assistant:

int wally_tx_add_raw_output(struct wally_tx *tx, uint64_t satoshi,
                            const unsigned char *script, size_t script_len,
                            uint32_t flags)
{
    if (!tx)
        return WALLY_EINVAL;
    return tx_add_elements_raw_output_at(tx, tx->num_outputs, satoshi,
                                         script, script_len,
                                         NULL, 0, NULL, 0, NULL, 0,
                                         NULL, 0, NULL, 0, flags, false);
}